

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O3

shared_ptr<UIContext> CreateUIContext(GraphicsContext *gc)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  GraphicsContext *in_RSI;
  shared_ptr<UIContext> sVar1;
  undefined1 local_31;
  int local_30 [2];
  GraphicsContext local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_30[1] = 0x400;
  local_30[0] = 0x400;
  local_28._vptr_GraphicsContext = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<GusteauChapter1UI,std::allocator<GusteauChapter1UI>,GraphicsContext&,char_const(&)[8],int,int>
            (a_Stack_20,(GusteauChapter1UI **)&local_28,(allocator<GusteauChapter1UI> *)&local_31,
             in_RSI,(char (*) [8])"gusteau",local_30 + 1,local_30);
  gc->_vptr_GraphicsContext = (_func_int **)local_28;
  gc[1]._vptr_GraphicsContext = (_func_int **)a_Stack_20[0]._M_pi;
  sVar1.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)gc;
  return (shared_ptr<UIContext>)sVar1.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UIContext> CreateUIContext(GraphicsContext& gc)
{
    auto ui = std::make_shared<GusteauChapter1UI>(gc, "gusteau", 1024, 1024);
    return ui;
}